

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.hpp
# Opt level: O3

State * __thiscall Tiles::initial(State *__return_storage_ptr__,Tiles *this)

{
  int iVar1;
  short sVar2;
  short sVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [12];
  unkbyte10 Var6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [11];
  undefined5 uVar10;
  undefined1 auVar11 [11];
  unkbyte9 Var12;
  undefined1 auVar13 [11];
  long lVar14;
  Fatal *this_00;
  byte bVar15;
  uint in_R8D;
  byte bVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [16];
  short sVar20;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ushort uVar29;
  uint uVar30;
  uint uVar32;
  uint uVar33;
  undefined1 auVar31 [16];
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  short sVar41;
  uint uVar42;
  uint uVar43;
  uint uVar48;
  uint uVar50;
  uint uVar51;
  uint uVar53;
  long lVar54;
  uint uVar55;
  undefined1 auVar44 [16];
  uint uVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  uint uVar62;
  char cVar67;
  char cVar68;
  char cVar70;
  uint uVar71;
  char cVar72;
  char cVar73;
  uint uVar75;
  undefined1 auVar63 [16];
  char cVar69;
  char cVar74;
  undefined1 auVar64 [16];
  uint uVar76;
  undefined4 uVar21;
  undefined6 uVar22;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined2 uVar47;
  uint uVar49;
  uint uVar52;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  
  __return_storage_ptr__->blank = -1;
  auVar19 = _DAT_00112020;
  lVar14 = 0;
  do {
    auVar23 = *(undefined1 (*) [16])(this + lVar14 * 4);
    auVar63._0_4_ = -(uint)(auVar23._0_4_ == 0);
    auVar63._4_4_ = -(uint)(auVar23._4_4_ == 0);
    auVar63._8_4_ = -(uint)(auVar23._8_4_ == 0);
    auVar63._12_4_ = -(uint)(auVar23._12_4_ == 0);
    in_R8D = movmskps(in_R8D,auVar63);
    if (in_R8D != 0) {
      bVar16 = ((byte)in_R8D & 2) >> 1;
      uVar25 = in_R8D & 4;
      bVar15 = (byte)in_R8D >> 3;
      in_R8D = CONCAT31((int3)(in_R8D >> 8),bVar15);
      if (uVar25 != 0) {
        bVar16 = 2;
      }
      if (bVar15 != 0) {
        bVar16 = 3;
      }
      __return_storage_ptr__->blank = bVar16 + (char)lVar14;
    }
    auVar23 = auVar23 & auVar19;
    sVar41 = auVar23._0_2_;
    cVar57 = (0 < sVar41) * (sVar41 < 0x100) * auVar23[0] - (0xff < sVar41);
    sVar41 = auVar23._2_2_;
    sVar20 = CONCAT11((0 < sVar41) * (sVar41 < 0x100) * auVar23[2] - (0xff < sVar41),cVar57);
    sVar41 = auVar23._4_2_;
    cVar58 = (0 < sVar41) * (sVar41 < 0x100) * auVar23[4] - (0xff < sVar41);
    sVar41 = auVar23._6_2_;
    uVar21 = CONCAT13((0 < sVar41) * (sVar41 < 0x100) * auVar23[6] - (0xff < sVar41),
                      CONCAT12(cVar58,sVar20));
    sVar41 = auVar23._8_2_;
    cVar59 = (0 < sVar41) * (sVar41 < 0x100) * auVar23[8] - (0xff < sVar41);
    sVar41 = auVar23._10_2_;
    uVar22 = CONCAT15((0 < sVar41) * (sVar41 < 0x100) * auVar23[10] - (0xff < sVar41),
                      CONCAT14(cVar59,uVar21));
    sVar41 = auVar23._12_2_;
    cVar60 = (0 < sVar41) * (sVar41 < 0x100) * auVar23[0xc] - (0xff < sVar41);
    sVar3 = auVar23._14_2_;
    sVar41 = (short)((uint)uVar21 >> 0x10);
    sVar2 = (short)((uint6)uVar22 >> 0x20);
    sVar3 = (short)(CONCAT17((0 < sVar3) * (sVar3 < 0x100) * auVar23[0xe] - (0xff < sVar3),
                             CONCAT16(cVar60,uVar22)) >> 0x30);
    *(uint *)(__return_storage_ptr__->tiles + lVar14) =
         CONCAT13((0 < sVar3) * (sVar3 < 0x100) * cVar60 - (0xff < sVar3),
                  CONCAT12((0 < sVar2) * (sVar2 < 0x100) * cVar59 - (0xff < sVar2),
                           CONCAT11((0 < sVar41) * (sVar41 < 0x100) * cVar58 - (0xff < sVar41),
                                    (0 < sVar20) * (sVar20 < 0x100) * cVar57 - (0xff < sVar20))));
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x10);
  cVar57 = __return_storage_ptr__->blank;
  if (-1 < cVar57) {
    iVar17 = (int)cVar57;
    iVar18 = (int)(cVar57 >> 7);
    uVar25 = 0;
    uVar26 = 0;
    uVar27 = 0;
    uVar28 = 0;
    lVar14 = 0;
    auVar19 = _DAT_00112030;
    auVar23 = _DAT_00112040;
    auVar24 = _DAT_00112050;
    do {
      lVar39 = auVar23._8_8_;
      lVar54 = auVar19._8_8_;
      uVar36 = -(uint)(auVar23._4_4_ == iVar18 && auVar23._0_4_ == iVar17);
      uVar37 = -(uint)(auVar23._8_4_ == iVar17 && auVar23._12_4_ == iVar18);
      uVar38 = -(uint)(auVar19._4_4_ == iVar18 && auVar19._0_4_ == iVar17);
      uVar40 = -(uint)(auVar19._8_4_ == iVar17 && auVar19._12_4_ == iVar18);
      uVar42 = auVar24._0_4_ >> 2;
      uVar49 = auVar24._4_4_;
      uVar48 = uVar49 >> 2;
      uVar52 = auVar24._8_4_;
      uVar55 = auVar24._12_4_;
      uVar51 = uVar52 >> 2;
      iVar1 = *(int *)(__return_storage_ptr__->tiles + lVar14);
      cVar57 = (char)iVar1;
      cVar58 = (char)((uint)iVar1 >> 8);
      cVar59 = (char)((uint)iVar1 >> 0x10);
      cVar60 = (char)((uint)iVar1 >> 0x18);
      uVar29 = CONCAT11((-(cVar58 < '\0') & 3U) + cVar58,(-(cVar57 < '\0') & 3U) + cVar57);
      uVar30 = CONCAT13((-(iVar1 < 0) & 3U) + cVar60,
                        CONCAT12((-(cVar59 < '\0') & 3U) + cVar59,uVar29));
      auVar63 = ZEXT416(CONCAT22((ushort)(uVar30 >> 0x12),uVar29 >> 2)) & _DAT_00112080 ^
                _DAT_00112090;
      cVar61 = auVar63[0] - DAT_00112090;
      cVar67 = auVar63[1] - DAT_00112090._1_1_;
      cVar68 = auVar63[2] - DAT_00112090._2_1_;
      cVar69 = auVar63[3] - DAT_00112090._3_1_;
      cVar70 = auVar63[4] - DAT_00112090._4_1_;
      cVar72 = auVar63[5] - DAT_00112090._5_1_;
      cVar73 = auVar63[6] - DAT_00112090._6_1_;
      cVar74 = auVar63[7] - DAT_00112090._7_1_;
      Var6 = CONCAT91(CONCAT81((long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11
                                                  (cVar74,cVar74),cVar73),cVar73),cVar72),cVar72),
                                                  cVar70),CONCAT11(cVar70,cVar74)) >> 8),cVar69),
                      cVar69);
      auVar5._2_10_ = Var6;
      auVar5[1] = cVar68;
      auVar5[0] = cVar68;
      auVar4._2_12_ = auVar5;
      auVar4[1] = cVar67;
      auVar4[0] = cVar67;
      auVar31._0_2_ = CONCAT11(cVar61,cVar61);
      auVar31._2_14_ = auVar4;
      uVar47 = (undefined2)Var6;
      auVar66._0_12_ = auVar31._0_12_;
      auVar66._12_2_ = uVar47;
      auVar66._14_2_ = uVar47;
      auVar65._12_4_ = auVar66._12_4_;
      auVar65._0_10_ = auVar31._0_10_;
      auVar65._10_2_ = auVar5._0_2_;
      auVar64._10_6_ = auVar65._10_6_;
      auVar64._0_8_ = auVar31._0_8_;
      auVar64._8_2_ = auVar5._0_2_;
      auVar7._4_8_ = auVar64._8_8_;
      auVar7._2_2_ = auVar4._0_2_;
      auVar7._0_2_ = auVar4._0_2_;
      uVar62 = ((int)auVar31._0_2_ >> 8) - uVar42;
      uVar71 = (auVar7._0_4_ >> 0x18) - uVar48;
      uVar75 = (auVar64._8_4_ >> 0x18) - uVar51;
      uVar76 = (auVar65._12_4_ >> 0x18) - (uVar55 >> 2);
      auVar63 = ZEXT416(uVar30) & _DAT_001120a0;
      auVar31 = auVar24 & _DAT_00112060;
      auVar9[9] = 0;
      auVar9._0_9_ = (unkuint9)uVar51 << 0x40;
      auVar9[10] = (char)(uVar48 >> 8);
      uVar10 = CONCAT41(CONCAT31(CONCAT21(auVar9._9_2_,(char)uVar48),cVar60 - auVar63[3]),
                        auVar24[3] >> 2);
      auVar11._6_5_ = uVar10;
      auVar11[5] = cVar59 - auVar63[2];
      auVar11[4] = (char)(uVar42 >> 0x10);
      auVar11._0_4_ = uVar42;
      Var12 = CONCAT81(CONCAT71(auVar11._4_7_,cVar58 - auVar63[1]),(char)(uVar42 >> 8));
      sVar41 = CONCAT11(cVar57 - auVar63[0],(char)uVar42);
      auVar13._2_9_ = Var12;
      auVar13._0_2_ = sVar41;
      uVar47 = (undefined2)uVar10;
      auVar46[0xb] = 0;
      auVar46._0_11_ = auVar13;
      auVar46._12_2_ = uVar47;
      auVar46._14_2_ = uVar47;
      auVar45._12_4_ = auVar46._12_4_;
      auVar45._0_10_ = auVar13._0_10_;
      auVar45._10_2_ = auVar11._4_2_;
      auVar44._10_6_ = auVar45._10_6_;
      auVar44._0_8_ = auVar13._0_8_;
      auVar44._8_2_ = auVar11._4_2_;
      uVar47 = (undefined2)Var12;
      auVar8._4_8_ = auVar44._8_8_;
      auVar8._2_2_ = uVar47;
      auVar8._0_2_ = uVar47;
      uVar43 = ((int)sVar41 >> 8) - auVar31._0_4_;
      uVar50 = (auVar8._0_4_ >> 0x18) - auVar31._4_4_;
      uVar53 = (auVar44._8_4_ >> 0x18) - auVar31._8_4_;
      uVar56 = (auVar45._12_4_ >> 0x18) - auVar31._12_4_;
      uVar30 = (int)uVar43 >> 0x1f;
      uVar48 = (int)uVar50 >> 0x1f;
      uVar32 = (int)uVar53 >> 0x1f;
      uVar34 = (int)uVar56 >> 0x1f;
      uVar42 = (int)uVar62 >> 0x1f;
      uVar51 = (int)uVar71 >> 0x1f;
      uVar33 = (int)uVar75 >> 0x1f;
      uVar35 = (int)uVar76 >> 0x1f;
      uVar25 = ~uVar36 & ((uVar43 ^ uVar30) - uVar30) + uVar25 + ((uVar62 ^ uVar42) - uVar42) |
               uVar25 & uVar36;
      uVar26 = ~uVar37 & ((uVar50 ^ uVar48) - uVar48) + uVar26 + ((uVar71 ^ uVar51) - uVar51) |
               uVar26 & uVar37;
      uVar27 = ~uVar38 & ((uVar53 ^ uVar32) - uVar32) + uVar27 + ((uVar75 ^ uVar33) - uVar33) |
               uVar27 & uVar38;
      uVar28 = ~uVar40 & ((uVar56 ^ uVar34) - uVar34) + uVar28 + ((uVar76 ^ uVar35) - uVar35) |
               uVar28 & uVar40;
      lVar14 = lVar14 + 4;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar39 + 4;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar54 + 4;
      auVar24._0_4_ = auVar24._0_4_ + 4;
      auVar24._4_4_ = uVar49 + 4;
      auVar24._8_4_ = uVar52 + 4;
      auVar24._12_4_ = uVar55 + 4;
    } while (lVar14 != 0x10);
    __return_storage_ptr__->h = (char)uVar28 + (char)uVar26 + (char)uVar27 + (char)uVar25;
    return __return_storage_ptr__;
  }
  this_00 = (Fatal *)__cxa_allocate_exception(0x80);
  Fatal::Fatal(this_00,"No blank tile");
  __cxa_throw(this_00,&Fatal::typeinfo,0);
}

Assistant:

State initial() const {
        State s;
        s.blank = -1;
        for (int i = 0; i < Ntiles; i++) {
            if (init[i] == 0)
                s.blank = i;
            s.tiles[i] = init[i];
        }
        if (s.blank < 0)
            throw Fatal("No blank tile");
        s.h = mdist(s.blank, s.tiles);
        return s;
    }